

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Approvals.h
# Opt level: O1

void ApprovalTests::
     TApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>>::
     verifyAll<std::vector<Rectangle3,std::allocator<Rectangle3>>>
               (string *header,vector<Rectangle3,_std::allocator<Rectangle3>_> *list,
               function<void_(Rectangle3,_std::basic_ostream<char,_std::char_traits<char>_>_&)>
               *converter,Options *options)

{
  _Any_data _Stack_58;
  code *local_48;
  __normal_iterator<const_Rectangle3_*,_std::vector<Rectangle3,_std::allocator<Rectangle3>_>_>
  local_38;
  __normal_iterator<const_Rectangle3_*,_std::vector<Rectangle3,_std::allocator<Rectangle3>_>_>
  local_30;
  
  local_30._M_current =
       (list->super__Vector_base<Rectangle3,_std::allocator<Rectangle3>_>)._M_impl.
       super__Vector_impl_data._M_start;
  local_38._M_current =
       (list->super__Vector_base<Rectangle3,_std::allocator<Rectangle3>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  ::std::function<void(Rectangle3_const&,std::ostream&)>::
  function<std::function<void(Rectangle3,std::ostream&)>&,void>
            ((function<void(Rectangle3_const&,std::ostream&)> *)_Stack_58._M_pod_data,converter);
  TApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>_>::
  verifyAll<__gnu_cxx::__normal_iterator<const_Rectangle3_*,_std::vector<Rectangle3,_std::allocator<Rectangle3>_>_>_>
            (header,&local_30,&local_38,
             (function<void_(const_Rectangle3_&,_std::basic_ostream<char,_std::char_traits<char>_>_&)>
              *)&_Stack_58,options);
  if (local_48 != (code *)0x0) {
    (*local_48)(&_Stack_58,&_Stack_58,__destroy_functor);
  }
  return;
}

Assistant:

static void verifyAll(
            const std::string& header,
            const Container& list,
            std::function<void(typename Container::value_type, std::ostream&)> converter,
            const Options& options = Options())
        {
            verifyAll<typename Container::const_iterator>(
                header, list.begin(), list.end(), converter, options);
        }